

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_chk_16_d(void)

{
  short sVar1;
  sint bound;
  sint src;
  
  sVar1 = (short)m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7];
  m68ki_cpu.not_z_flag = m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7] & 0xffff;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  if ((sVar1 < 0) || ((short)m68ki_cpu.dar[m68ki_cpu.ir & 7] < sVar1)) {
    m68ki_cpu.n_flag = (uint)(sVar1 < 0) << 7;
    m68ki_exception_trap(6);
  }
  return;
}

Assistant:

static void m68k_op_chk_16_d(void)
{
	sint src = MAKE_INT_16(DX);
	sint bound = MAKE_INT_16(DY);

	FLAG_Z = ZFLAG_16(src); /* Undocumented */
	FLAG_V = VFLAG_CLEAR;   /* Undocumented */
	FLAG_C = CFLAG_CLEAR;   /* Undocumented */

	if(src >= 0 && src <= bound)
	{
		return;
	}
	FLAG_N = (src < 0)<<7;
	m68ki_exception_trap(EXCEPTION_CHK);
}